

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::remap_parameter
          (CombinedImageSamplerHandler *this,uint32_t id)

{
  SPIRVariable *pSVar1;
  iterator iVar2;
  key_type *pkVar3;
  _Elt_pointer puVar4;
  key_type local_14;
  
  pSVar1 = maybe_get_backing_variable(this->compiler,id);
  if (pSVar1 != (SPIRVariable *)0x0) {
    id = (pSVar1->super_IVariant).self.id;
  }
  puVar4 = (this->parameter_remapping).c.
           super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar4 != (this->parameter_remapping).c.
                super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (puVar4 == (this->parameter_remapping).c.
                  super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar4 = (this->parameter_remapping).c.
               super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    iVar2 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&puVar4[-1]._M_h,&local_14);
    pkVar3 = (key_type *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur + 0xc);
    if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) {
      pkVar3 = &local_14;
    }
    id = *pkVar3;
  }
  return id;
}

Assistant:

uint32_t Compiler::CombinedImageSamplerHandler::remap_parameter(uint32_t id)
{
	auto *var = compiler.maybe_get_backing_variable(id);
	if (var)
		id = var->self;

	if (parameter_remapping.empty())
		return id;

	auto &remapping = parameter_remapping.top();
	auto itr = remapping.find(id);
	if (itr != end(remapping))
		return itr->second;
	else
		return id;
}